

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O3

int __thiscall
anon_unknown.dwarf_38a::NinjaMain::ToolQuery(NinjaMain *this,Options *options,int argc,char **argv)

{
  Edge *pEVar1;
  bool bVar2;
  uint uVar3;
  Node *pNVar4;
  pointer ppNVar5;
  pointer ppEVar6;
  pointer ppNVar7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  pointer ppEVar11;
  string err;
  DyndepLoader dyndep_loader;
  bool local_89;
  string local_88;
  ulong local_68;
  NinjaMain *local_60;
  char **local_58;
  Node *local_50;
  ulong local_48;
  DyndepLoader local_40;
  
  local_58 = argv;
  if (argc == 0) {
    Error("expected a target to query");
    uVar3 = 1;
  }
  else {
    local_40.state_ = &this->state_;
    local_40.disk_interface_ = &(this->disk_interface_).super_DiskInterface;
    if (argc < 1) {
      uVar3 = 0;
    }
    else {
      local_68 = (ulong)(uint)argc;
      local_89 = true;
      local_48 = 0;
      local_60 = this;
      do {
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        local_88._M_string_length = 0;
        local_88.field_2._M_local_buf[0] = '\0';
        pNVar4 = CollectTarget(local_60,local_58[local_48],&local_88);
        if (pNVar4 == (Node *)0x0) {
          Error("%s",local_88._M_dataplus._M_p);
        }
        else {
          printf("%s:\n",(pNVar4->path_)._M_dataplus._M_p);
          pEVar1 = pNVar4->in_edge_;
          local_50 = pNVar4;
          if (pEVar1 != (Edge *)0x0) {
            pNVar4 = pEVar1->dyndep_;
            if (((pNVar4 != (Node *)0x0) && (pNVar4->dyndep_pending_ == true)) &&
               (bVar2 = DyndepLoader::LoadDyndeps(&local_40,pNVar4,&local_88), !bVar2)) {
              Warning("%s\n",local_88._M_dataplus._M_p);
            }
            printf("  input: %s\n",(pEVar1->rule_->name_)._M_dataplus._M_p);
            ppNVar5 = (pEVar1->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            ppNVar7 = (pEVar1->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            if (0 < (int)((ulong)((long)ppNVar7 - (long)ppNVar5) >> 3)) {
              uVar10 = 0;
              do {
                lVar8 = (long)ppNVar7 - (long)ppNVar5 >> 3;
                pcVar9 = "| ";
                if (uVar10 < (ulong)(lVar8 - ((long)pEVar1->implicit_deps_ +
                                             (long)pEVar1->order_only_deps_))) {
                  pcVar9 = "";
                }
                if ((ulong)(lVar8 - pEVar1->order_only_deps_) <= uVar10) {
                  pcVar9 = "|| ";
                }
                printf("    %s%s\n",pcVar9,(ppNVar5[uVar10]->path_)._M_dataplus._M_p);
                uVar10 = uVar10 + 1;
                ppNVar5 = (pEVar1->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                ppNVar7 = (pEVar1->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
              } while ((long)uVar10 < (long)(int)((ulong)((long)ppNVar7 - (long)ppNVar5) >> 3));
            }
          }
          puts("  outputs:");
          pNVar4 = local_50;
          ppEVar11 = (local_50->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ppEVar6 = (local_50->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          if (ppEVar11 != ppEVar6) {
            do {
              ppNVar5 = ((*ppEVar11)->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              if (ppNVar5 !=
                  ((*ppEVar11)->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                do {
                  printf("    %s\n",((*ppNVar5)->path_)._M_dataplus._M_p);
                  ppNVar5 = ppNVar5 + 1;
                } while (ppNVar5 !=
                         ((*ppEVar11)->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
                ppEVar6 = (pNVar4->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
              }
              ppEVar11 = ppEVar11 + 1;
            } while (ppEVar11 != ppEVar6);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,
                          CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                   local_88.field_2._M_local_buf[0]) + 1);
        }
        if (pNVar4 == (Node *)0x0) break;
        local_48 = local_48 + 1;
        local_89 = local_48 < local_68;
      } while (local_48 != local_68);
      uVar3 = (uint)local_89;
    }
  }
  return uVar3;
}

Assistant:

int NinjaMain::ToolQuery(const Options* options, int argc, char* argv[]) {
  if (argc == 0) {
    Error("expected a target to query");
    return 1;
  }

  DyndepLoader dyndep_loader(&state_, &disk_interface_);

  for (int i = 0; i < argc; ++i) {
    string err;
    Node* node = CollectTarget(argv[i], &err);
    if (!node) {
      Error("%s", err.c_str());
      return 1;
    }

    printf("%s:\n", node->path().c_str());
    if (Edge* edge = node->in_edge()) {
      if (edge->dyndep_ && edge->dyndep_->dyndep_pending()) {
        if (!dyndep_loader.LoadDyndeps(edge->dyndep_, &err)) {
          Warning("%s\n", err.c_str());
        }
      }
      printf("  input: %s\n", edge->rule_->name().c_str());
      for (int in = 0; in < (int)edge->inputs_.size(); in++) {
        const char* label = "";
        if (edge->is_implicit(in))
          label = "| ";
        else if (edge->is_order_only(in))
          label = "|| ";
        printf("    %s%s\n", label, edge->inputs_[in]->path().c_str());
      }
    }
    printf("  outputs:\n");
    for (vector<Edge*>::const_iterator edge = node->out_edges().begin();
         edge != node->out_edges().end(); ++edge) {
      for (vector<Node*>::iterator out = (*edge)->outputs_.begin();
           out != (*edge)->outputs_.end(); ++out) {
        printf("    %s\n", (*out)->path().c_str());
      }
    }
  }
  return 0;
}